

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlutils.cpp
# Opt level: O2

void libcellml::removeCellml1XNamespaces(XmlNodePtr *node,bool childrenOnly)

{
  element_type *peVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  undefined7 in_register_00000031;
  XmlNodePtr tempNode;
  XmlNamespaceMap definedNamespaces;
  allocator<char> local_a1;
  __shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined4 local_8c;
  string local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_8c = (undefined4)CONCAT71(in_register_00000031,childrenOnly);
  std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a0,&node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>);
  do {
    if (local_a0._M_ptr == (XmlNode *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
      return;
    }
    XmlNode::definedNamespaces_abi_cxx11_((XmlNamespaceMap *)&local_60,local_a0._M_ptr);
    for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &local_60._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var3 + 2),"http://www.cellml.org/cellml/1.0#");
      peVar1 = local_a0._M_ptr;
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"http://www.cellml.org/cellml/1.0#",&local_a1);
        XmlNode::removeNamespaceDefinition(peVar1,&local_88);
LAB_00233496:
        std::__cxx11::string::~string((string *)&local_88);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(p_Var3 + 2),"http://www.cellml.org/cellml/1.1#");
        peVar1 = local_a0._M_ptr;
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_88,"http://www.cellml.org/cellml/1.1#",&local_a1);
          XmlNode::removeNamespaceDefinition(peVar1,&local_88);
          goto LAB_00233496;
        }
      }
    }
    XmlNode::firstChild((XmlNode *)&local_88);
    removeCellml1XNamespaces((XmlNodePtr *)&local_88,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
    if ((char)local_8c == '\0') {
      XmlNode::next((XmlNode *)&local_88);
    }
    else {
      local_88._M_dataplus._M_p = (pointer)0x0;
      local_88._M_string_length = 0;
    }
    std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_a0,(__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
  } while( true );
}

Assistant:

void removeCellml1XNamespaces(const XmlNodePtr &node, bool childrenOnly)
{
    auto tempNode = node;
    while (tempNode != nullptr) {
        auto definedNamespaces = tempNode->definedNamespaces();
        XmlNamespaceMap::const_iterator it;
        for (it = definedNamespaces.begin(); it != definedNamespaces.end(); ++it) {
            if (it->second == CELLML_1_0_NS) {
                tempNode->removeNamespaceDefinition(CELLML_1_0_NS);
            } else if (it->second == CELLML_1_1_NS) {
                tempNode->removeNamespaceDefinition(CELLML_1_1_NS);
            }
        }

        removeCellml1XNamespaces(tempNode->firstChild());

        if (childrenOnly) {
            tempNode = nullptr;
        } else {
            tempNode = tempNode->next();
        }
    }
}